

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter.cpp
# Opt level: O2

set<BlockFilterType,_std::less<BlockFilterType>,_std::allocator<BlockFilterType>_> *
AllBlockFilterTypes(void)

{
  long *plVar1;
  undefined8 *puVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 *in_FS_OFFSET;
  undefined1 local_21;
  undefined1 *local_20;
  long local_18;
  
  local_18 = in_FS_OFFSET[5];
  if (AllBlockFilterTypes()::types == '\0') {
    iVar3 = __cxa_guard_acquire(&AllBlockFilterTypes()::types);
    if (iVar3 != 0) {
      AllBlockFilterTypes::types._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      AllBlockFilterTypes::types._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      AllBlockFilterTypes::types._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &AllBlockFilterTypes::types._M_t._M_impl.super__Rb_tree_header._M_header;
      AllBlockFilterTypes::types._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &AllBlockFilterTypes::types._M_t._M_impl.super__Rb_tree_header._M_header;
      AllBlockFilterTypes::types._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      __cxa_atexit(std::
                   set<BlockFilterType,_std::less<BlockFilterType>,_std::allocator<BlockFilterType>_>
                   ::~set,&AllBlockFilterTypes::types,&__dso_handle);
      __cxa_guard_release(&AllBlockFilterTypes()::types);
    }
  }
  local_20 = &local_21;
  plVar1 = (long *)*in_FS_OFFSET;
  *plVar1 = (long)&local_20;
  puVar2 = (undefined8 *)*in_FS_OFFSET;
  *puVar2 = std::once_flag::_Prepare_execution::
            _Prepare_execution<(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/mutex:775:25)>
            ::anon_class_1_0_00000001::__invoke;
  iVar3 = pthread_once(&AllBlockFilterTypes::flag._M_once,__once_proxy);
  if (iVar3 == 0) {
    *plVar1 = 0;
    *puVar2 = 0;
    if (in_FS_OFFSET[5] == local_18) {
      return &AllBlockFilterTypes::types;
    }
  }
  else if (in_FS_OFFSET[5] == local_18) {
    uVar4 = std::__throw_system_error(iVar3);
    *plVar1 = 0;
    *puVar2 = 0;
    if (in_FS_OFFSET[5] == local_18) {
      _Unwind_Resume(uVar4);
    }
  }
  __stack_chk_fail();
}

Assistant:

const std::set<BlockFilterType>& AllBlockFilterTypes()
{
    static std::set<BlockFilterType> types;

    static std::once_flag flag;
    std::call_once(flag, []() {
            for (const auto& entry : g_filter_types) {
                types.insert(entry.first);
            }
        });

    return types;
}